

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idyntree-model-info.cpp
# Opt level: O2

void addOptions(parser *cmd)

{
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"model",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Model to load.",&local_ea)
  ;
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  cmdline::parser::add<std::__cxx11::string>(cmd,&local_c8,'m',&local_e8,true,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"print",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Print the model.",&local_ea);
  cmdline::parser::add(cmd,&local_c8,'p',&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"total-mass",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Get the total mass of a model.",&local_ea);
  cmdline::parser::add(cmd,&local_c8,'\0',&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"link-com",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Print inertial information of a given link",&local_ea);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  cmdline::parser::add<std::__cxx11::string>(cmd,&local_c8,'\0',&local_e8,false,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"link-com-frame",&local_e9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,
             "If link-com is passed, link-com-frame specifies the frame in which the inertia information is printed (assuming that the model is in zero position)"
             ,&local_ea);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  cmdline::parser::add<std::__cxx11::string>(cmd,&local_c8,'\0',&local_e8,false,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"frame-pose",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Print the referenceFrame_H_frame transform.",&local_ea);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  cmdline::parser::add<std::__cxx11::string>(cmd,&local_c8,'\0',&local_e8,false,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"frame-pose-reference-frame",&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,
             "If frame-pose is passed, frame-pose-reference-frame specifies the reference frame in which the frame pose is expressed (assuming that the model is in zero position)"
             ,&local_ea);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  cmdline::parser::add<std::__cxx11::string>(cmd,&local_c8,'\0',&local_e8,false,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void addOptions(cmdline::parser &cmd)
{
    cmd.add<std::string>("model", 'm',
                         "Model to load.",
                         true);

    cmd.add("print", 'p',
            "Print the model.");

    cmd.add("total-mass", '\0',
            "Get the total mass of a model.");

    cmd.add<std::string>("link-com", '\0',
                         "Print inertial information of a given link",false);

    cmd.add<std::string>("link-com-frame", '\0',
                         "If link-com is passed, link-com-frame specifies the frame in which the inertia information is printed (assuming that the model is in zero position)",false);

    cmd.add<std::string>("frame-pose", '\0',
                         "Print the referenceFrame_H_frame transform.",false);

    cmd.add<std::string>("frame-pose-reference-frame", '\0',
                         "If frame-pose is passed, frame-pose-reference-frame specifies the reference frame in which the frame pose is expressed (assuming that the model is in zero position)",false);
}